

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::EnumValueOptions::SerializeWithCachedSizesToArray
          (EnumValueOptions *this,uint8 *target)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  Type *this_00;
  uint8 *puVar2;
  int i;
  int index;
  
  for (index = 0; index < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      index = index + 1) {
    this_00 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                        (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    target[0] = 0xba;
    target[1] = '>';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray(this_00->_cached_size_,target + 2);
    target = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,puVar2);
  }
  puVar2 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,target);
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar2 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,puVar2);
    return puVar2;
  }
  return puVar2;
}

Assistant:

::google::protobuf::uint8* EnumValueOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}